

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cc
# Opt level: O2

uint64_t absl::lts_20240722::log_internal::anon_unknown_1::DecodeVarint(Span<const_char> *buf)

{
  byte *pbVar1;
  reference pcVar2;
  ulong i;
  ulong n;
  uint64_t uVar3;
  byte bVar4;
  
  bVar4 = 0;
  uVar3 = 0;
  i = 0;
  do {
    n = i;
    if (buf->len_ <= i) break;
    pbVar1 = (byte *)Span<const_char>::operator[](buf,i);
    uVar3 = uVar3 | (ulong)(*pbVar1 & 0x7f) << (bVar4 & 0x3f);
    n = i + 1;
    pcVar2 = Span<const_char>::operator[](buf,i);
    bVar4 = bVar4 + 7;
    i = n;
  } while (*pcVar2 < '\0');
  Span<const_char>::remove_prefix(buf,n);
  return uVar3;
}

Assistant:

uint64_t DecodeVarint(absl::Span<const char> *buf) {
  uint64_t value = 0;
  size_t s = 0;
  while (s < buf->size()) {
    value |= static_cast<uint64_t>(static_cast<unsigned char>((*buf)[s]) & 0x7f)
             << 7 * s;
    if (!((*buf)[s++] & 0x80)) break;
  }
  buf->remove_prefix(s);
  return value;
}